

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QDebug operator<<(QDebug debug,GraphicsItemFlags flags)

{
  long lVar1;
  bool bVar2;
  uint in_EDX;
  undefined4 in_register_00000034;
  long *plVar3;
  int i;
  int iVar4;
  long in_FS_OFFSET;
  QDebug local_48;
  undefined1 local_40 [8];
  long local_38;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,
                            flags.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                            super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QTextStream::operator<<((QTextStream *)*plVar3,'(');
  if (((QTextStream *)*plVar3)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)*plVar3,' ');
  }
  iVar4 = 0;
  bVar2 = false;
  do {
    if ((1 << ((byte)iVar4 & 0x1f) & in_EDX) != 0) {
      if (bVar2) {
        QTextStream::operator<<((QTextStream *)*plVar3,'|');
        if (((QTextStream *)*plVar3)[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)*plVar3,' ');
        }
      }
      local_48.stream = (Stream *)*plVar3;
      *(int *)(local_48.stream + 0x28) = *(int *)(local_48.stream + 0x28) + 1;
      operator<<((Stream *)local_40,(GraphicsItemFlag)&local_48);
      QDebug::~QDebug((QDebug *)local_40);
      QDebug::~QDebug(&local_48);
      bVar2 = true;
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x11);
  QTextStream::operator<<((QTextStream *)*plVar3,')');
  if (((QTextStream *)*plVar3)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)*plVar3,' ');
  }
  lVar1 = *plVar3;
  *plVar3 = 0;
  *(long *)debug.stream = lVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, QGraphicsItem::GraphicsItemFlags flags)
{
    debug << '(';
    bool f = false;
    for (int i = 0; i < 17; ++i) {
        if (flags & (1 << i)) {
            if (f)
                debug << '|';
            f = true;
            debug << QGraphicsItem::GraphicsItemFlag(int(flags & (1 << i)));
        }
    }
    debug << ')';
    return debug;
}